

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

void __thiscall zmq::session_base_t::read_activated(session_base_t *this,pipe_t *pipe_)

{
  pipe_t *this_00;
  i_engine *piVar1;
  
  this_00 = this->_pipe;
  if ((this_00 == pipe_) || (this->_zap_pipe == pipe_)) {
    piVar1 = this->_engine;
    if (piVar1 != (i_engine *)0x0) {
      if (this_00 == pipe_) {
        (*piVar1->_vptr_i_engine[6])(piVar1);
        return;
      }
      (*piVar1->_vptr_i_engine[7])(piVar1);
      return;
    }
    if (this_00 != (pipe_t *)0x0) {
      pipe_t::check_read(this_00);
      return;
    }
  }
  else {
    read_activated();
  }
  return;
}

Assistant:

void zmq::session_base_t::read_activated (pipe_t *pipe_)
{
    // Skip activating if we're detaching this pipe
    if (unlikely (pipe_ != _pipe && pipe_ != _zap_pipe)) {
        zmq_assert (_terminating_pipes.count (pipe_) == 1);
        return;
    }

    if (unlikely (_engine == NULL)) {
        if (_pipe)
            _pipe->check_read ();
        return;
    }

    if (likely (pipe_ == _pipe))
        _engine->restart_output ();
    else {
        // i.e. pipe_ == zap_pipe
        _engine->zap_msg_available ();
    }
}